

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::Clear(MethodOptions *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  MethodOptions *pMStack_18;
  uint32_t cached_has_bits;
  MethodOptions *this_local;
  
  this_local = (MethodOptions *)&this->field_0;
  local_1c = 0;
  pMStack_18 = this;
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear
            (&(this->field_0)._impl_.uninterpreted_option_);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 1) != 0) {
    if ((this->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                 ,0x2fde,"_impl_.features_ != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    FeatureSet::Clear((this->field_0)._impl_.features_);
  }
  if ((local_1c & 6) != 0) {
    memset((void *)((long)&this->field_0 + 0x40),0,8);
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void MethodOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.MethodOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.features_ != nullptr);
    _impl_.features_->Clear();
  }
  if ((cached_has_bits & 0x00000006u) != 0) {
    ::memset(&_impl_.deprecated_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.idempotency_level_) -
        reinterpret_cast<char*>(&_impl_.deprecated_)) + sizeof(_impl_.idempotency_level_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}